

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
anon_unknown.dwarf_6f47f7::KeyConverter::ToPKBytes(KeyConverter *this,CPubKey *key)

{
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  XOnlyPubKey xonly_pubkey;
  MiniscriptContext in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  CPubKey *in_stack_ffffffffffffff68;
  allocator_type *in_stack_ffffffffffffff90;
  allocator_type *__a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uchar *in_stack_ffffffffffffffa8;
  allocator_type local_29;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = miniscript::IsTapscript(in_stack_ffffffffffffff58);
  if (bVar1) {
    XOnlyPubKey::XOnlyPubKey
              ((XOnlyPubKey *)in_stack_ffffffffffffff68,(CPubKey *)&stack0xffffffffffffffd8);
    XOnlyPubKey::begin((XOnlyPubKey *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
    ;
    XOnlyPubKey::end((XOnlyPubKey *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::allocator<unsigned_char>::allocator
              ((allocator<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              (this_00,in_stack_ffffffffffffffa8,(uchar *)in_RDI,in_stack_ffffffffffffff90);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  else {
    CPubKey::begin((CPubKey *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    CPubKey::end(in_stack_ffffffffffffff68);
    __a = &local_29;
    std::allocator<unsigned_char>::allocator
              ((allocator<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              (this_00,in_stack_ffffffffffffffa8,(uchar *)in_RDI,__a);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> ToPKBytes(const CPubKey& key) const {
        if (!miniscript::IsTapscript(m_script_ctx)) {
            return {key.begin(), key.end()};
        }
        const XOnlyPubKey xonly_pubkey{key};
        return {xonly_pubkey.begin(), xonly_pubkey.end()};
    }